

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O2

void __thiscall
basisu::
vector<std::__detail::_Node_const_iterator<std::pair<const_basisu::vec<6U,_float>,_basisu::weighted_block_group>,_false,_true>_>
::push_back(vector<std::__detail::_Node_const_iterator<std::pair<const_basisu::vec<6U,_float>,_basisu::weighted_block_group>,_false,_true>_>
            *this,_Node_const_iterator<std::pair<const_basisu::vec<6U,_float>,_basisu::weighted_block_group>,_false,_true>
                  *obj)

{
  uint uVar1;
  _Node_const_iterator<std::pair<const_basisu::vec<6U,_float>,_basisu::weighted_block_group>,_false,_true>
  *p_Var2;
  ulong uVar3;
  
  p_Var2 = this->m_p;
  uVar1 = this->m_size;
  uVar3 = (ulong)uVar1;
  if (p_Var2 + uVar3 <= obj ||
      (obj < p_Var2 ||
      p_Var2 == (_Node_const_iterator<std::pair<const_basisu::vec<6U,_float>,_basisu::weighted_block_group>,_false,_true>
                 *)0x0)) {
    if (this->m_capacity <= uVar1) {
      increase_capacity(this,uVar1 + 1,true,false);
      p_Var2 = this->m_p;
      uVar3 = (ulong)this->m_size;
    }
    p_Var2[uVar3].
    super__Node_iterator_base<std::pair<const_basisu::vec<6U,_float>,_basisu::weighted_block_group>,_true>
    ._M_cur = (obj->
              super__Node_iterator_base<std::pair<const_basisu::vec<6U,_float>,_basisu::weighted_block_group>,_true>
              )._M_cur;
    this->m_size = this->m_size + 1;
    return;
  }
  __assert_fail("!m_p || (&obj < m_p) || (&obj >= (m_p + m_size))",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                ,0x267,
                "void basisu::vector<std::__detail::_Node_const_iterator<std::pair<const basisu::vec<6, float>, basisu::weighted_block_group>, false, true>>::push_back(const T &) [T = std::__detail::_Node_const_iterator<std::pair<const basisu::vec<6, float>, basisu::weighted_block_group>, false, true>]"
               );
}

Assistant:

BASISU_FORCE_INLINE void push_back(const T& obj)
      {
         assert(!m_p || (&obj < m_p) || (&obj >= (m_p + m_size)));

         if (m_size >= m_capacity)
            increase_capacity(m_size + 1, true);

         scalar_type<T>::construct(m_p + m_size, obj);
         m_size++;
      }